

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O2

DomSetType * __thiscall
dg::llvmdg::PostDominanceFrontiers::calculate
          (PostDominanceFrontiers *this,PostDominatorTree *DT,DomTreeNode *Node)

{
  char cVar1;
  _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
  *this_00;
  long lVar2;
  DomSetType *pDVar3;
  _Base_ptr p_Var4;
  DomTreeNode *__range2;
  pred_range pVar5;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __begin3;
  BasicBlock *P;
  BasicBlock *BB;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> local_60;
  PostDominanceFrontiers *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  local_38 = *(BasicBlock **)Node;
  local_58 = this;
  this_00 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
             *)std::
               map<llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
               ::operator[](&this->frontiers,&local_38);
  if (*(int *)(DT + 8) != 0) {
    if (local_38 != (BasicBlock *)0x0) {
      pVar5 = llvm::predecessors(local_38);
      local_60 = pVar5.begin_iterator.It.UI.U;
      while (local_60.It.UI.U != pVar5.end_iterator.It.UI.U.It) {
        local_40 = *(BasicBlock **)(*(long *)((long)local_60.It.UI.U + 0x18) + 0x28);
        lVar2 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::getNode((BasicBlock *)DT);
        if ((lVar2 != 0) && (*(DomTreeNode **)(lVar2 + 8) != Node)) {
          std::
          _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
          ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,&local_40);
        }
        llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
        operator++(&local_60);
      }
    }
    local_48 = *(undefined8 **)(Node + 0x18);
    local_50 = local_48 + *(uint *)(Node + 0x20);
    for (; local_48 != local_50; local_48 = local_48 + 1) {
      pDVar3 = calculate(local_58,DT,(DomTreeNode *)*local_48);
      for (p_Var4 = (pDVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pDVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        local_60.It.UI.U = *(user_iterator_impl<llvm::User> *)(p_Var4 + 1);
        llvm::DominatorTreeBase<llvm::BasicBlock,true>::getNode((BasicBlock *)DT);
        cVar1 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::properlyDominates
                          ((DomTreeNodeBase *)DT,(DomTreeNodeBase *)Node);
        if (cVar1 == '\0') {
          std::
          _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
          ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,(BasicBlock **)&local_60);
        }
      }
    }
  }
  return (DomSetType *)this_00;
}

Assistant:

DomSetType &calculate(const llvm::PostDominatorTree &DT,
                          const llvm::DomTreeNode *Node) {
        llvm::BasicBlock *BB = Node->getBlock();
        auto &S = frontiers[BB];

#if LLVM_VERSION_MAJOR >= 11
        bool empty_roots = DT.root_size() == 0;
#else
        bool empty_roots = DT.getRoots().empty();
#endif
        if (empty_roots)
            return S;

        // calculate DFlocal[Node]
        if (BB) {
            for (auto *P : predecessors(BB)) {
                // Does Node immediately dominate this predecessor?
                auto *SINode = DT[P];
                if (SINode && SINode->getIDom() != Node)
                    S.insert(P);
            }
        }

        // At this point, S is DFlocal.  Now we union in DFup's of our children.
        // Loop through and visit the nodes that Node immediately dominates
        // (Node's children in the IDomTree)
        for (auto *IDominee : *Node) {
            const auto &ChildDF = calculate(DT, IDominee);

            for (auto *cdfi : ChildDF) {
                if (!DT.properlyDominates(Node, DT[cdfi]))
                    S.insert(cdfi);
            }
        }

        return S;
    }